

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool sx_strstr_wildcard(char *str,char *pattern)

{
  code *pcVar1;
  undefined1 uVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  if (str == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x176,"str");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  if (pattern == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x177,"pattern");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  pcVar4 = (char *)0x0;
  pcVar5 = (char *)0x0;
  do {
    while( true ) {
      cVar3 = *str;
      bVar7 = cVar3 == '\0';
      pcVar6 = pattern;
      while (bVar7) {
        bVar7 = *pcVar6 == '\0';
        if (bVar7) {
          return bVar7;
        }
        if (pcVar5 == (char *)0x0) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                            ,0x181,"s");
          pcVar1 = (code *)swi(3);
          uVar2 = (*pcVar1)();
          return (_Bool)uVar2;
        }
        cVar3 = *pcVar5;
        if (cVar3 == '\0') {
          return bVar7;
        }
        bVar7 = false;
        str = pcVar5;
        pcVar5 = pcVar5 + 1;
        pcVar6 = pcVar4;
      }
      if (pcVar6 == (char *)0x0) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                          ,0x188,"pattern");
        pcVar1 = (code *)swi(3);
        uVar2 = (*pcVar1)();
        return (_Bool)uVar2;
      }
      if (*pcVar6 != cVar3) break;
      pcVar6 = pcVar6 + 1;
LAB_00107030:
      str = str + 1;
      pattern = pcVar6;
    }
    if (*pcVar6 != '*') {
      if (pcVar4 == (char *)0x0) {
        return false;
      }
      goto LAB_00107030;
    }
    pcVar4 = pcVar6 + 1;
    pcVar5 = str;
    pattern = pcVar4;
    if (pcVar6[1] == '\0') {
      return true;
    }
  } while( true );
}

Assistant:

bool sx_strstr_wildcard(const char* str, const char* pattern)
{
    sx_assert(str);
    sx_assert(pattern);

    const char* w = NULL;    // last `*`
    const char* s = NULL;    // last checked char

    // loop 1 char at a time
    while (1) {
        if (!*str) {
            if (!*pattern)
                return true;
            sx_assert(s);
            if (!*s)
                return false;
            str = s++;
            pattern = w;
            continue;
        } else {
            sx_assert(pattern);
            if (*pattern != *str) {
                if ('*' == *pattern) {
                    w = ++pattern;
                    s = str;
                    // "*" -> "foobar"
                    if (*pattern)
                        continue;
                    return true;
                } else if (w) {
                    str++;
                    // "*ooba*" -> "foobar"
                    continue;
                }
                return false;
            }
        }

        str++;
        pattern++;
    }

    return true;
}